

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5efc::TestCheckCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int line;
  TestDetails testDetails;
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  RecordingReporter reporter;
  int local_8b4;
  TestDetails local_8b0;
  float local_88c;
  float local_888;
  float local_884;
  ScopedCurrentTest local_880;
  TestDetails local_870;
  TestResults local_850;
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  char local_628 [256];
  int local_528;
  char local_524 [256];
  char local_424 [256];
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_8b4 = 0;
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628[0] = '\0';
  local_524[0] = '\0';
  local_424[0] = '\0';
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,&local_838);
  UnitTest::TestDetails::TestDetails(&local_8b0,"test","suite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&local_880,&local_850,&local_8b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_884 = 1.0;
  local_888 = 1.1;
  local_88c = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x10c);
  UnitTest::CheckClose<float,float,float>(pTVar1,&local_884,&local_888,&local_88c,&local_870);
  local_8b4 = 0x10c;
  ScopedCurrentTest::~ScopedCurrentTest(&local_880);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar3,0x10f);
  UnitTest::CheckEqual(pTVar1,"test",local_424,&local_8b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar3,0x110);
  UnitTest::CheckEqual(pTVar1,"suite",local_524,&local_8b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar3,0x111);
  UnitTest::CheckEqual(pTVar1,"filename",local_628,&local_8b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar3,0x112);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8b4,&local_528,&local_8b0);
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST(CheckCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("test", "suite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		CHECK_CLOSE (1.0f, 1.1f, 0.01f);    line = __LINE__;
    }

    CHECK_EQUAL("test", reporter.lastFailedTest);
    CHECK_EQUAL("suite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}